

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

int Gia_ManBmcFindFirst(Gia_Man_t *pFrames)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pFrames_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(pFrames);
    bVar4 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCo(pFrames,local_24);
      bVar4 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    pGVar2 = Gia_ObjChild0(pGStack_20);
    pGVar3 = Gia_ManConst0(pFrames);
    if (pGVar2 != pGVar3) {
      return local_24;
    }
    local_24 = local_24 + 1;
  }
  return -1;
}

Assistant:

int Gia_ManBmcFindFirst( Gia_Man_t * pFrames )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachPo( pFrames, pObj, i )
        if ( Gia_ObjChild0(pObj) != Gia_ManConst0(pFrames) )
            return i;
    return -1;
}